

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char_const(&)[30],std::__cxx11::string&,char_const(&)[6]>
                   (string *__return_storage_ptr__,char (*a) [30],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [6])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_118;
  cmAlphaNum local_e0;
  cmAlphaNum local_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_70;
  string_view local_58;
  string *local_48;
  string_view local_40;
  string *local_30;
  
  cmAlphaNum::cmAlphaNum(&local_a8,*a);
  local_70.first = cmAlphaNum::View(&local_a8);
  local_70.second = local_a8.RValueString_;
  local_e0.RValueString_ = (string *)0x0;
  local_e0.View_._M_str = (b->_M_dataplus)._M_p;
  local_e0.View_._M_len = b->_M_string_length;
  local_58 = cmAlphaNum::View(&local_e0);
  local_48 = local_e0.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_118,*args);
  local_40 = cmAlphaNum::View(&local_118);
  local_30 = local_118.RValueString_;
  views._M_len = 3;
  views._M_array = &local_70;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}